

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

void __thiscall
CAssignSubscriptStm::CAssignSubscriptStm
          (CAssignSubscriptStm *this,CIdExp *idExpression,IExpression *offset,
          IExpression *valueExpression)

{
  CIdExp *pCVar1;
  IExpression *pIVar2;
  PositionInfo PVar3;
  
  (this->super_IStatement).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_0017a620;
  (this->idExpression)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
  super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
  super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl = (CIdExp *)0x0;
  (this->indexExpression)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>
  ._M_t.super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = (IExpression *)0x0;
  (this->valueExpression)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>
  ._M_t.super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = (IExpression *)0x0;
  PVar3 = PositionInfo::operator+
                    (&(idExpression->super_IExpression).super_PositionedNode.position,
                     &(valueExpression->super_PositionedNode).position);
  (this->super_IStatement).super_PositionedNode.position = PVar3;
  pCVar1 = (this->idExpression)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>.
           _M_t.super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  (this->idExpression)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
  super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
  super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl = idExpression;
  if (pCVar1 != (CIdExp *)0x0) {
    (**(code **)(*(long *)&(pCVar1->super_IExpression).super_PositionedNode + 0x10))();
  }
  pIVar2 = (this->indexExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (this->indexExpression)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>
  ._M_t.super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = offset;
  if (pIVar2 != (IExpression *)0x0) {
    (**(code **)(*(long *)&(pIVar2->super_PositionedNode).super_INode + 0x10))();
  }
  pIVar2 = (this->valueExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (this->valueExpression)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>
  ._M_t.super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = valueExpression;
  if (pIVar2 != (IExpression *)0x0) {
    (**(code **)(*(long *)&(pIVar2->super_PositionedNode).super_INode + 0x10))();
    return;
  }
  return;
}

Assistant:

CAssignSubscriptStm::CAssignSubscriptStm(
	CIdExp* idExpression,
	IExpression* offset,
	IExpression* valueExpression
) {
	this->position = idExpression->position + valueExpression->position;
	this->idExpression = std::unique_ptr<CIdExp>(idExpression);
	this->indexExpression = std::unique_ptr<IExpression>(offset);
	this->valueExpression = std::unique_ptr<IExpression>(valueExpression);
}